

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<void> __thiscall kj::anon_unknown_31::HttpOutputStream::flush(HttpOutputStream *this)

{
  PromiseNode *extraout_RDX;
  long in_RSI;
  Promise<void> PVar1;
  ForkedPromise<void> fork;
  undefined1 auStack_38 [32];
  
  Promise<void>::fork((Promise<void> *)(auStack_38 + 0x10));
  _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)auStack_38);
  Own<kj::_::PromiseNode>::operator=
            ((Own<kj::_::PromiseNode> *)(in_RSI + 8),(Own<kj::_::PromiseNode> *)auStack_38);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)auStack_38);
  _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)this);
  Own<kj::_::ForkHub<kj::_::Void>_>::dispose
            ((Own<kj::_::ForkHub<kj::_::Void>_> *)(auStack_38 + 0x10));
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> flush() {
    auto fork = writeQueue.fork();
    writeQueue = fork.addBranch();
    return fork.addBranch();
  }